

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O2

void __thiscall imrt::EvaluationFunction::generate_voxel_dose_functions(EvaluationFunction *this)

{
  double dVar1;
  pointer pvVar2;
  pointer pdVar3;
  long lVar4;
  ulong uVar5;
  pointer pdVar6;
  ostream *poVar7;
  _Base_ptr p_Var8;
  long lVar9;
  uint uVar10;
  int k;
  long lVar11;
  long lVar12;
  _Rb_tree_header *p_Var13;
  long lVar14;
  double local_2c8;
  set<double,_std::greater<double>,_std::allocator<double>_> dose;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  ofstream myfile;
  
  lVar12 = 0;
  while( true ) {
    p_Var13 = &dose._M_t._M_impl.super__Rb_tree_header;
    uVar5 = (ulong)this->nb_organs;
    if ((long)uVar5 <= lVar12) break;
    dose._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    dose._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    dose._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pvVar2 = (this->voxel_dose).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar3 = *(pointer *)
              ((long)&pvVar2[lVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data + 8);
    for (pdVar6 = pvVar2[lVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start; pdVar6 != pdVar3; pdVar6 = pdVar6 + 1) {
      *pdVar6 = 0.0;
    }
    lVar14 = 0;
    lVar11 = 0;
    dose._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var13->_M_header;
    dose._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var13->_M_header;
    for (; lVar11 < (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar12]; lVar11 = lVar11 + 1) {
      std::
      _Rb_tree<double,double,std::_Identity<double>,std::greater<double>,std::allocator<double>>::
      _M_insert_unique<double_const&>
                ((_Rb_tree<double,double,std::_Identity<double>,std::greater<double>,std::allocator<double>>
                  *)&dose,(double *)
                          (*(long *)&(this->Z).
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar12].
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data + lVar14));
      dVar1 = *(double *)
               (*(long *)&(this->Z).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar12].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data + lVar14);
      if (dVar1 < 150.0) {
        lVar9 = (long)(int)dVar1;
        lVar4 = *(long *)&(this->voxel_dose).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar12].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        *(double *)(lVar4 + lVar9 * 8) = *(double *)(lVar4 + lVar9 * 8) + 1.0;
      }
      lVar14 = lVar14 + 8;
    }
    std::ofstream::ofstream((string *)&myfile);
    std::__cxx11::to_string(&local_250,(int)lVar12);
    std::operator+(&local_290,"plotter/organ_xls",&local_250);
    std::operator+(&local_270,&local_290,".dat");
    std::ofstream::open((string *)&myfile,(_Ios_Openmode)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_250);
    for (p_Var8 = dose._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &dose._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      poVar7 = std::ostream::_M_insert<double>(*(double *)(p_Var8 + 1));
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    std::ofstream::close();
    std::ofstream::~ofstream((string *)&myfile);
    std::
    _Rb_tree<double,_double,_std::_Identity<double>,_std::greater<double>,_std::allocator<double>_>
    ::~_Rb_tree(&dose._M_t);
    lVar12 = lVar12 + 1;
  }
  lVar12 = 0;
  while( true ) {
    if ((int)uVar5 <= lVar12) break;
    std::ofstream::ofstream((string *)&myfile);
    std::__cxx11::to_string(&local_290,(int)lVar12);
    std::operator+(&local_270,"plotter/organ",&local_290);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dose,
                   &local_270,".txt");
    std::ofstream::open((string *)&myfile,(_Ios_Openmode)(string *)&dose);
    std::__cxx11::string::~string((string *)&dose);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    local_2c8 = 0.0;
    for (uVar10 = 0x95; -1 < (int)uVar10; uVar10 = uVar10 - 1) {
      local_2c8 = local_2c8 +
                  *(double *)
                   (*(long *)&(this->voxel_dose).
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar12].
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data + (ulong)uVar10 * 8);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&myfile,uVar10 + 1);
      std::operator<<(poVar7,",");
      poVar7 = std::ostream::_M_insert<double>
                         (local_2c8 /
                          (double)(this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar12]);
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    std::ofstream::close();
    std::ofstream::~ofstream((string *)&myfile);
    lVar12 = lVar12 + 1;
    uVar5 = (ulong)(uint)this->nb_organs;
  }
  return;
}

Assistant:

void EvaluationFunction::generate_voxel_dose_functions (){

	for(int o=0; o<nb_organs; o++){
		std::set<double, std::greater<double> > dose;
		std::fill(voxel_dose[o].begin(), voxel_dose[o].end(), 0.0);
		for(int k=0; k<nb_voxels[o]; k++){

			dose.insert(Z[o][k]);
			if(Z[o][k]<150)
				voxel_dose[o][(int) Z[o][k]]+=1;
		}

		ofstream myfile;
		myfile.open ("plotter/organ_xls"+std::to_string(o)+".dat");
		for(auto v:dose){
			myfile << v << endl;
		}
		myfile.close();

	}


	for(int o=0; o<nb_organs; o++){
		ofstream myfile;
		myfile.open ("plotter/organ"+std::to_string(o)+".txt");

		double cum=0.0;
		for(int k=149; k>=0; k--){
			cum+= voxel_dose[o][k];
			myfile << k+1 << "," << cum/nb_voxels[o] << endl;
		}

		myfile.close();
	}
}